

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O0

bool __thiscall wallet::anon_unknown_5::WalletImpl::unlockCoin(WalletImpl *this,COutPoint *output)

{
  long lVar1;
  byte bVar2;
  unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_> *in_RSI;
  COutPoint *in_RDI;
  long in_FS_OFFSET;
  unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_> batch;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock14;
  __shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffff88;
  CWallet *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  CWallet *this_00;
  char *in_stack_ffffffffffffffb8;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffffc0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (CWallet *)((in_RDI->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            (in_stack_ffffffffffffff88);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff88);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             (char *)this_00,(int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            (in_stack_ffffffffffffff88);
  CWallet::GetDatabase(in_stack_ffffffffffffff98);
  std::make_unique<wallet::WalletBatch,wallet::WalletDatabase&>((WalletDatabase *)this_00);
  std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            (in_stack_ffffffffffffff88);
  _GLOBAL__N_1::std::unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_>::get
            ((unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_> *)
             in_stack_ffffffffffffff88);
  bVar2 = CWallet::UnlockCoin(this_00,in_RDI,
                              (WalletBatch *)
                              CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  _GLOBAL__N_1::std::unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_>::
  ~unique_ptr(in_RSI);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff88);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar2 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool unlockCoin(const COutPoint& output) override
    {
        LOCK(m_wallet->cs_wallet);
        std::unique_ptr<WalletBatch> batch = std::make_unique<WalletBatch>(m_wallet->GetDatabase());
        return m_wallet->UnlockCoin(output, batch.get());
    }